

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivSetColor_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fOdds)

{
  Gia_Rpr_t GVar1;
  Gia_Obj_t *pGVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  
  iVar7 = 0;
  while( true ) {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar6 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555;
    GVar1 = p->pReprs[iVar6];
    bVar3 = GVar1._3_1_;
    bVar9 = bVar3 >> 6 & 1;
    uVar4 = 0x40000000;
    if (fOdds != 0) {
      bVar9 = bVar3 >> 7;
      uVar4 = 0x80000000;
    }
    p->pReprs[iVar6] = (Gia_Rpr_t)(uVar4 | (uint)GVar1);
    if (bVar9 != 0) {
      return iVar7;
    }
    uVar4 = (uint)*(undefined8 *)pObj;
    if (((uVar4 & 0x9fffffff) != 0x9fffffff) ||
       (uVar8 = (uint)((ulong)*(undefined8 *)pObj >> 0x20),
       (int)(uVar8 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
      if ((-1 < (int)uVar4) && ((uVar4 & 0x1fffffff) != 0x1fffffff)) {
        iVar6 = Gia_ManEquivSetColor_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff),fOdds);
        iVar5 = Gia_ManEquivSetColor_rec
                          (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),fOdds);
        return iVar7 + iVar5 + iVar6 + 1;
      }
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x356,"int Gia_ManEquivSetColor_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    uVar8 = uVar8 & 0x1fffffff;
    iVar6 = p->vCis->nSize;
    if ((int)uVar8 < iVar6 - p->nRegs) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1f8,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar5 = p->vCos->nSize;
    uVar8 = (iVar5 - iVar6) + uVar8;
    if (((int)uVar8 < 0) || (iVar5 <= (int)uVar8)) break;
    iVar6 = p->vCos->pArray[uVar8];
    if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pObj = p->pObjs + iVar6 + -(ulong)((uint)*(undefined8 *)(p->pObjs + iVar6) & 0x1fffffff);
    iVar7 = iVar7 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManEquivSetColor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fOdds )
{
    if ( Gia_ObjVisitColor( p, Gia_ObjId(p,pObj), fOdds ) )
        return 0;
    if ( Gia_ObjIsRo(p, pObj) )
        return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj)), fOdds );
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), fOdds )
             + Gia_ManEquivSetColor_rec( p, Gia_ObjFanin1(pObj), fOdds );
}